

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

const_iterator __thiscall
spvtools::opt::analysis::DefUseManager::UsersBegin(DefUseManager *this,Instruction *def)

{
  const_iterator cVar1;
  key_type local_30;
  Instruction *local_20;
  Instruction *def_local;
  DefUseManager *this_local;
  
  local_30.user = (Instruction *)0x0;
  local_30.def = def;
  local_20 = def;
  def_local = (Instruction *)this;
  cVar1 = std::
          set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
          ::lower_bound(&this->id_to_users_,&local_30);
  return (const_iterator)cVar1._M_node;
}

Assistant:

DefUseManager::IdToUsersMap::const_iterator DefUseManager::UsersBegin(
    const Instruction* def) const {
  return id_to_users_.lower_bound(
      UserEntry{const_cast<Instruction*>(def), nullptr});
}